

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Reset
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  uhugeint_t local_28;
  
  (this->minimum_delta).lower = 0xffffffffffffffff;
  *(undefined4 *)&(this->minimum).lower = 0xffffffff;
  *(undefined4 *)((long)&(this->minimum).lower + 4) = 0xffffffff;
  *(undefined4 *)&(this->minimum).upper = 0xffffffff;
  *(undefined4 *)((long)&(this->minimum).upper + 4) = 0xffffffff;
  (this->minimum_delta).upper = 0x7fffffffffffffff;
  (this->maximum_delta).lower = 0;
  (this->maximum).lower = 0;
  (this->maximum).upper = 0;
  (this->maximum_delta).upper = -0x8000000000000000;
  hugeint_t::hugeint_t((hugeint_t *)&local_28,0);
  (this->delta_offset).lower = local_28.lower;
  (this->delta_offset).upper = local_28.upper;
  this->all_valid = true;
  this->all_invalid = true;
  this->can_do_delta = false;
  this->can_do_for = false;
  this->compression_buffer_idx = 0;
  uhugeint_t::uhugeint_t(&local_28,0);
  (this->min_max_diff).lower = local_28.lower;
  (this->min_max_diff).upper = local_28.upper;
  hugeint_t::hugeint_t((hugeint_t *)&local_28,0);
  (this->min_max_delta_diff).lower = local_28.lower;
  (this->min_max_delta_diff).upper = local_28.upper;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}